

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Args.cpp
# Opt level: O2

bool idx2::OptVal(int NArgs,cstr *Args,cstr Opt,v3<idx2::t2<char,_int>_> *Val)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  int in_EAX;
  size_t sVar4;
  long lVar5;
  anon_union_8_2_2df48d06_for_stref_0 local_40;
  undefined4 local_38;
  
  lVar1 = 6;
  do {
    lVar5 = lVar1;
    bVar3 = (byte)in_EAX;
    if (NArgs <= lVar5) goto LAB_00103eb1;
    in_EAX = strncmp(Args[lVar5 + -5],Opt,0x20);
    lVar1 = lVar5 + 1;
  } while (in_EAX != 0);
  (Val->field_0).field_0.X.First = *Args[lVar5 + -4];
  local_40 = (anon_union_8_2_2df48d06_for_stref_0)
             ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + -3))->Ptr;
  sVar4 = strlen(local_40.Ptr);
  local_38 = (undefined4)sVar4;
  bVar2 = ToInt((stref *)&local_40,&(Val->field_0).E[0].Second);
  (Val->field_0).field_0.Y.First = *Args[lVar5 + -3];
  if (bVar2) {
    local_40 = (anon_union_8_2_2df48d06_for_stref_0)
               ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5 + -2))->Ptr;
    sVar4 = strlen(local_40.Ptr);
    local_38 = (undefined4)sVar4;
    bVar2 = ToInt((stref *)&local_40,&(Val->field_0).E[1].Second);
    (Val->field_0).field_0.Z.First = *Args[lVar5 + -1];
    if (bVar2) {
      local_40 = (anon_union_8_2_2df48d06_for_stref_0)
                 ((anon_union_8_2_2df48d06_for_stref_0 *)(Args + lVar5))->Ptr;
      sVar4 = strlen(local_40.Ptr);
      local_38 = (undefined4)sVar4;
      bVar3 = ToInt((stref *)&local_40,&(Val->field_0).E[2].Second);
      goto LAB_00103eb1;
    }
  }
  else {
    (Val->field_0).field_0.Z.First = *Args[lVar5 + -1];
  }
  bVar3 = 0;
LAB_00103eb1:
  return (bool)(lVar5 < NArgs & bVar3);
}

Assistant:

bool
OptVal(int NArgs, cstr* Args, cstr Opt, v3<t2<char, int>>* Val)
{
  for (int I = 1; I + 5 < NArgs; ++I)
  {
    if (strncmp(Args[I], Opt, 32) == 0)
    {
      bool Success = true;
      (*Val)[0].First = Args[I + 1][0];
      Success = Success && ToInt(Args[I + 2], &(*Val)[0].Second);
      (*Val)[1].First = Args[I + 2][0];
      Success = Success && ToInt(Args[I + 3], &(*Val)[1].Second);
      (*Val)[2].First = Args[I + 4][0];
      Success = Success && ToInt(Args[I + 5], &(*Val)[2].Second);
      return Success;
    }
  }

  return false;
}